

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

void hexnan(U *rvp,char **sp)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  byte *pbVar7;
  uint uVar8;
  byte bVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  
  pcVar6 = *sp + -1;
  do {
    pcVar5 = pcVar6;
    bVar9 = pcVar5[2];
    pcVar6 = pcVar5 + 1;
  } while ((byte)(bVar9 - 1) < 0x20);
  if (bVar9 == 0x30) {
    if ((byte)(pcVar5[3] | 0x20U) == 0x78) {
      bVar9 = pcVar5[4];
      pcVar6 = pcVar5 + 3;
      goto LAB_00105726;
    }
    bVar9 = 0x30;
  }
  else {
LAB_00105726:
    if (bVar9 == 0) {
      uVar11 = 0;
      uVar8 = 0;
      goto LAB_001057e2;
    }
  }
  pbVar7 = (byte *)(pcVar6 + 1);
  bVar1 = true;
  bVar10 = false;
  uVar8 = 0;
  uVar11 = 0;
  do {
    bVar3 = false;
    while( true ) {
      pbVar7 = pbVar7 + 1;
      uVar12 = (ulong)bVar9;
      if (""[uVar12] != 0) break;
      if (0x20 < bVar9) goto LAB_001057d6;
      bVar2 = bVar1;
      bVar4 = bVar3;
      if (bVar10) {
        bVar2 = false;
        bVar4 = true;
      }
      if (bVar1) {
        bVar3 = bVar4;
      }
      bVar9 = *pbVar7;
      bVar1 = bVar2;
      if (bVar9 == 0) goto LAB_001057e2;
    }
    if (bVar3) {
      uVar8 = uVar11;
      uVar11 = 0;
    }
    if (bVar1) {
      uVar8 = uVar8 << 4 | uVar11 >> 0x1c;
    }
    uVar11 = uVar11 << 4 | ""[uVar12] & 0xf;
    bVar9 = *pbVar7;
    bVar10 = true;
  } while (bVar9 != 0);
LAB_001057e2:
  if ((uVar8 & 0xfffff) != 0 || uVar11 != 0) {
    rvp->L[1] = uVar8 & 0xfffff | 0x7ff00000;
    rvp->L[0] = uVar11;
  }
  return;
  while( true ) {
    bVar9 = *pbVar7;
    uVar12 = (ulong)(uint)(int)(char)bVar9;
    pbVar7 = pbVar7 + 1;
    if ((int)(char)bVar9 == 0) break;
LAB_001057d6:
    if ((int)uVar12 == 0x29) {
      *sp = (char *)pbVar7;
      break;
    }
  }
  goto LAB_001057e2;
}

Assistant:

static void
hexnan(U *rvp, const char **sp)
{
	ULong c, x[2];
	const char *s;
	int c1, havedig, udx0, xshift;

	/**** if (!hexdig['0']) hexdig_init(); ****/
	x[0] = x[1] = 0;
	havedig = xshift = 0;
	udx0 = 1;
	s = *sp;
	/* allow optional initial 0x or 0X */
	while((c = *(const unsigned char*)(s+1)) && c <= ' ')
		++s;
	if (s[1] == '0' && (s[2] == 'x' || s[2] == 'X'))
		s += 2;
	while((c = *(const unsigned char*)++s)) {
		if ((c1 = hexdig[c]))
			c  = c1 & 0xf;
		else if (c <= ' ') {
			if (udx0 && havedig) {
				udx0 = 0;
				xshift = 1;
				}
			continue;
			}
#ifdef GDTOA_NON_PEDANTIC_NANCHECK
		else if (/*(*/ c == ')' && havedig) {
			*sp = s + 1;
			break;
			}
		else
			return;	/* invalid form: don't change *sp */
#else
		else {
			do {
				if (/*(*/ c == ')') {
					*sp = s + 1;
					break;
					}
				} while((c = *++s));
			break;
			}
#endif
		havedig = 1;
		if (xshift) {
			xshift = 0;
			x[0] = x[1];
			x[1] = 0;
			}
		if (udx0)
			x[0] = (x[0] << 4) | (x[1] >> 28);
		x[1] = (x[1] << 4) | c;
		}
	if ((x[0] &= 0xfffff) || x[1]) {
		word0(rvp) = Exp_mask | x[0];
		word1(rvp) = x[1];
		}
	}